

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tls_connection.cc
# Opt level: O2

void __thiscall AliTlsConnection::AliTlsConnection(AliTlsConnection *this,string *host,int port)

{
  (this->super_AliConnection)._vptr_AliConnection = (_func_int **)&PTR_Connect_001bcb60;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->host_);
  this->port_ = port;
  return;
}

Assistant:

AliTlsConnection::AliTlsConnection(std::string host, int port) {
  this->host_ = host;
  this->port_ = port;
}